

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cc
# Opt level: O2

uchar * SHA512(uchar *d,size_t n,uchar *md)

{
  SHA512_CTX ctx;
  SHA512_CTX SStack_f8;
  
  BCM_sha512_init(&SStack_f8);
  BCM_sha512_update(&SStack_f8,d,n);
  BCM_sha512_final(md,&SStack_f8);
  OPENSSL_cleanse(&SStack_f8,0xd8);
  return md;
}

Assistant:

uint8_t *SHA512(const uint8_t *data, size_t len,
                uint8_t out[SHA512_DIGEST_LENGTH]) {
  SHA512_CTX ctx;
  BCM_sha512_init(&ctx);
  BCM_sha512_update(&ctx, data, len);
  BCM_sha512_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}